

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.cpp
# Opt level: O2

void __thiscall
wavingz::demod::state_machine::sample_sm::bitlock_t::process
          (bitlock_t *this,sample_sm_t *ctx,optional<bool> *sample)

{
  symbol_sm_t *psVar1;
  state_base_t *psVar2;
  pointer __p;
  reference_const_type pbVar3;
  pointer __p_00;
  double dVar4;
  double dVar5;
  undefined8 local_28;
  __uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::idle_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::idle_t>_>
  local_20;
  
  if ((sample->super_type).m_initialized == false) {
    local_28 = (state_base_t *)((ulong)local_28 & 0xffffffffffffff00);
    psVar1 = (ctx->sym_sm)._M_data;
    psVar2 = (psVar1->current_state_m)._M_t.
             super___uniq_ptr_impl<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
             .super__Head_base<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_false>
             ._M_head_impl;
    (**psVar2->_vptr_state_base_t)(psVar2,psVar1,&local_28);
    __p_00 = (pointer)operator_new(8);
    __p_00->_vptr_state_base_t = (_func_int **)&PTR_process_00116d50;
    local_20._M_t.
    super__Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::idle_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::idle_t>_>
    .super__Head_base<0UL,_wavingz::demod::state_machine::sample_sm::idle_t_*,_false>._M_head_impl =
         (tuple<wavingz::demod::state_machine::sample_sm::idle_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::idle_t>_>
          )(_Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::idle_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::idle_t>_>
            )0x0;
    local_28 = (state_base_t *)0x0;
    std::
    __uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
    ::reset((__uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
             *)&ctx->current_state_m,__p_00);
    std::
    unique_ptr<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
    ::~unique_ptr((unique_ptr<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
                   *)&local_28);
    std::
    unique_ptr<wavingz::demod::state_machine::sample_sm::idle_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::idle_t>_>
    ::~unique_ptr((unique_ptr<wavingz::demod::state_machine::sample_sm::idle_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::idle_t>_>
                   *)&local_20);
  }
  else {
    pbVar3 = boost::optional<bool>::get(sample);
    if (*pbVar3 == this->last_sample) {
      dVar4 = this->samples_per_symbol;
      dVar5 = this->num_samples + 1.0;
    }
    else {
      pbVar3 = boost::optional<bool>::get(sample);
      this->last_sample = *pbVar3;
      dVar4 = this->samples_per_symbol;
      dVar5 = dVar4 * 3.0 * 0.25;
    }
    this->num_samples = dVar5;
    if (dVar4 <= dVar5) {
      pbVar3 = boost::optional<bool>::get(sample);
      local_28._1_1_ = *pbVar3;
      local_28._0_1_ = 1;
      (**((((ctx->sym_sm)._M_data)->current_state_m)._M_t.
          super___uniq_ptr_impl<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
          ._M_t.
          super__Tuple_impl<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
          .super__Head_base<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_false>.
         _M_head_impl)->_vptr_state_base_t)();
      this->num_samples = this->num_samples - this->samples_per_symbol;
    }
  }
  return;
}

Assistant:

void
bitlock_t::process(sample_sm_t& ctx, const boost::optional<bool>& sample)
{
    // On no signal, return to idle
    if (sample == boost::none)
    {
        ctx.emit(boost::none);
        ctx.state(std::unique_ptr<idle_t>(new idle_t()));
    }
    else
    {
        if(*sample != last_sample)
        {
            last_sample = *sample;
            num_samples = 3.0 * samples_per_symbol / 4.0;
        }
        else
        {
            num_samples = num_samples + 1.0;
        }
        if (num_samples >= samples_per_symbol)
        {
            ctx.emit(*sample);
            num_samples -= samples_per_symbol; // keep alignment
        }
    }
}